

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_serializer.cpp
# Opt level: O2

Table * getFromCsv(Table *__return_storage_ptr__,string *fileName)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  char cVar4;
  bool bVar5;
  istream *piVar6;
  size_type sVar7;
  string *psVar8;
  int iVar9;
  string str;
  string cur;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  fstream in;
  
  std::fstream::fstream(&in,(string *)fileName,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    cur._M_dataplus._M_p = (pointer)&cur.field_2;
    cur._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    cur.field_2._M_local_buf[0] = '\0';
    columns.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columns.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    columns.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&str);
    std::__cxx11::string::push_back((char)&str);
    sVar3 = str._M_string_length;
    _Var2 = str._M_dataplus;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      if (_Var2._M_p[sVar7] == ',') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&columns,&cur);
        std::__cxx11::string::assign((char *)&cur);
      }
      else {
        std::__cxx11::string::push_back((char)&cur);
      }
    }
    Table::Table(__return_storage_ptr__,&columns);
    bVar5 = false;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in,(string *)&str);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::push_back((char)&str);
      sVar3 = str._M_string_length;
      _Var2 = str._M_dataplus;
      cVar4 = (char)&cur;
      if (bVar5) {
        iVar9 = 0;
        for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
          cVar1 = _Var2._M_p[sVar7];
          if (cVar1 != ' ') {
            if (cVar1 == ',') {
              if ((int)*cur._M_dataplus._M_p - 0x30U < 10) {
                std::__cxx11::string::string((string *)&local_2a0,(string *)&cur);
                psVar8 = &local_2a0;
                Table::push_new_value_in_column(__return_storage_ptr__,iVar9,psVar8);
              }
              else {
                std::__cxx11::string::string((string *)&local_2c0,(string *)&cur);
                psVar8 = &local_2c0;
                Table::push_new_value_in_column(__return_storage_ptr__,iVar9,psVar8);
              }
              std::__cxx11::string::~string((string *)psVar8);
              std::__cxx11::string::assign((char *)&cur);
              iVar9 = iVar9 + 1;
            }
            else {
              std::__cxx11::string::push_back(cVar4);
            }
          }
        }
      }
      else {
        iVar9 = 0;
        for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
          cVar1 = _Var2._M_p[sVar7];
          if (cVar1 != ' ') {
            if (cVar1 == ',') {
              if ((int)*cur._M_dataplus._M_p - 0x30U < 10) {
                Table::define_column_type(__return_storage_ptr__,iVar9,FLOAT);
                std::__cxx11::string::string((string *)&local_260,(string *)&cur);
                psVar8 = &local_260;
                Table::push_new_value_in_column(__return_storage_ptr__,iVar9,psVar8);
              }
              else {
                Table::define_column_type(__return_storage_ptr__,iVar9,STRING);
                std::__cxx11::string::string((string *)&local_280,(string *)&cur);
                psVar8 = &local_280;
                Table::push_new_value_in_column(__return_storage_ptr__,iVar9,psVar8);
              }
              std::__cxx11::string::~string((string *)psVar8);
              std::__cxx11::string::assign((char *)&cur);
              iVar9 = iVar9 + 1;
            }
            else {
              std::__cxx11::string::push_back(cVar4);
            }
          }
        }
        bVar5 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&columns);
    std::__cxx11::string::~string((string *)&cur);
    std::__cxx11::string::~string((string *)&str);
    std::fstream::~fstream(&in);
    return __return_storage_ptr__;
  }
  std::operator+(&cur,"File ",fileName);
  std::operator+(&str,&cur," can\'t be opened\n");
  std::operator<<((ostream *)&std::cerr,(string *)&str);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&cur);
  exit(1);
}

Assistant:

Table getFromCsv(const std::string &fileName) {
    std::fstream in(fileName, std::ios::in);
    if (!in.is_open()){
        std::cerr << "File "+fileName+" can't be opened\n";
        exit(EXIT_FAILURE);
    }
    std::string str, cur;
    std::vector<std::string> columns;
    std::getline(in, str);
    str += ',';
    for (char ch:str){
        if (ch == ','){
            columns.push_back(cur);
            cur = "";
        }else
            cur += ch;
    }
    Table t(columns);
    bool is_defined = false;
    while (std::getline(in, str)){
        str += ',';
        if (!is_defined){
            int cnt = 0;
            for (char ch:str){
                if (ch == ' ') continue;
                if (ch == ','){
                    if (isdigit(cur[0])){
                        t.define_column_type(cnt, t.FLOAT);
                        t.push_new_value_in_column(cnt, cur);
                    }else{
                        t.define_column_type(cnt, t.STRING);
                        t.push_new_value_in_column(cnt, cur);
                    }
                    cur = "";
                    cnt++;
                }else
                    cur += ch;
            }
            is_defined = true;
            continue;
        }
        int cnt = 0;
        for (char ch:str){
            if (ch == ' ') continue;
            if (ch == ','){
                if (isdigit(cur[0])){
                    t.push_new_value_in_column(cnt, cur);
                }else{
                    t.push_new_value_in_column(cnt, cur);
                }
                cur = "";
                cnt++;
            }else
                cur += ch;
        }
    }
    return t;
}